

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<std::__cxx11::string,12ul>::vector_s<10ul>
          (vector_s<std::__cxx11::string,12ul> *this,
          vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
          *other)

{
  long lVar1;
  const_reference pvVar2;
  size_type sVar3;
  pointer insert_ptr;
  size_type i;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  *other_local;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
  *this_local;
  
  *(undefined8 *)this = 0;
  *(vector_s<std::__cxx11::string,12ul> **)(this + 0x188) = this + 8;
  insert_ptr = (pointer)vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                        ::size(other);
  while (insert_ptr != (pointer)0x0) {
    insert_ptr = (pointer)((long)&insert_ptr[-1].field_2._M_allocated_capacity + 0xf);
    lVar1 = *(long *)(this + 0x188);
    pvVar2 = vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             ::operator[](other,(size_type)insert_ptr);
    std::__cxx11::string::string((string *)(lVar1 + (long)insert_ptr * 0x20),(string *)pvVar2);
  }
  sVar3 = vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
          ::size(other);
  *(size_type *)this = sVar3;
  return;
}

Assistant:

vector_s(const vector_s<T, CAPACITY_OTHER>& other)
    {
        for (size_type i = other.size(); i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(other[i]);
        }
        size_ = other.size();
    }